

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O1

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
Storage::Disk::FAT::GetFile
          (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,shared_ptr<Storage::Disk::Disk> *disk,Volume *volume,File *file)

{
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  pointer pvVar4;
  uchar *__first;
  uchar *__last;
  ulong uVar5;
  int iVar6;
  Sector *pSVar7;
  uint16_t uVar8;
  uint uVar9;
  bool bVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  Parser parser;
  void *local_98;
  pointer puStack_90;
  pointer local_88;
  Parser local_78;
  
  Encodings::MFM::Parser::Parser(&local_78,Double,disk);
  local_98 = (void *)0x0;
  puStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  uVar8 = file->starting_cluster;
  uVar1 = (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._M_engaged;
  do {
    bVar2 = volume->sectors_per_cluster;
    bVar10 = bVar2 != 0;
    if (bVar10) {
      iVar3 = volume->first_data_sector;
      uVar9 = 0;
      do {
        iVar6 = (uVar8 - 2) * (uint)bVar2 + iVar3 + uVar9;
        uVar5 = (long)iVar6 / (long)(int)(uint)volume->sectors_per_track;
        uVar5 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
        pSVar7 = Encodings::MFM::Parser::sector
                           (&local_78,(int)((long)uVar5 % (long)(int)(uint)volume->head_count),
                            (int)((long)uVar5 / (long)(int)(uint)volume->head_count),
                            (char)(iVar6 % (int)(uint)volume->sectors_per_track) + '\x01');
        if ((pSVar7 == (Sector *)0x0) ||
           (pvVar4 = (pSVar7->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           pvVar4 == (pSVar7->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00448ded:
          uVar1 = false;
          goto LAB_00448df5;
        }
        __first = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        __last = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        if ((long)__last - (long)__first != (ulong)volume->bytes_per_sector) goto LAB_00448ded;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (__first,__last,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98
                  );
        uVar9 = uVar9 + 1;
        bVar10 = uVar9 < volume->sectors_per_cluster;
      } while (bVar10);
    }
    uVar8 = (volume->fat).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8];
LAB_00448df5:
    if (bVar10) {
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged = (bool)uVar1;
      goto LAB_00448e52;
    }
    if (0xfef < uVar8) {
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged = (bool)uVar1;
      *(void **)&(__return_storage_ptr__->
                 super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl =
           local_98;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
           puStack_90;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10) =
           local_88;
      local_98 = (void *)0x0;
      puStack_90 = (pointer)0x0;
      local_88 = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged = true;
LAB_00448e52:
      if (local_98 != (void *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      std::
      _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
      ::~_Rb_tree(&local_78.sectors_by_address_by_track_._M_t);
      if (local_78.disk_.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.disk_.
                   super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<std::vector<uint8_t>> FAT::GetFile(const std::shared_ptr<Storage::Disk::Disk> &disk, const Volume &volume, const File &file) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	std::vector<uint8_t> contents;

	// In FAT cluster numbers describe a linked list via the FAT table, with values above $FF0 being reserved
	// (relevantly: FF7 means bad cluster; FF8–FFF mean end-of-file).
	uint16_t cluster = file.starting_cluster;
	do {
		const int sector = volume.sector_for_cluster(cluster);

		for(int c = 0; c < volume.sectors_per_cluster; c++) {
			const auto address = volume.chs_for_sector(sector + c);

			const Storage::Encodings::MFM::Sector *const sector_contents =
				parser.sector(address.head, address.cylinder, uint8_t(address.sector));
			if(!sector_contents || sector_contents->samples.empty() || sector_contents->samples[0].size() != volume.bytes_per_sector) {
				return std::nullopt;
			}
			std::copy(sector_contents->samples[0].begin(), sector_contents->samples[0].end(), std::back_inserter(contents));
		}

		cluster = volume.fat[cluster];
	} while(cluster < 0xff0);

	return contents;
}